

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *this)

{
  long *plVar1;
  char cVar2;
  locale *plVar3;
  num_writer f;
  char cVar4;
  int iVar5;
  numpunct *pnVar6;
  long *plVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  string_view prefix;
  undefined1 auVar12 [16];
  string groups;
  locale local_a0 [8];
  ulong local_98;
  ulong local_90;
  long *local_88;
  long local_80;
  long local_78 [2];
  ulong local_68;
  ulong uStack_60;
  int local_58;
  undefined4 uStack_54;
  long **pplStack_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  
  plVar3 = (locale *)(this->writer->locale_).locale_;
  if (plVar3 == (locale *)0x0) {
    std::locale::locale(local_a0);
  }
  else {
    std::locale::locale(local_a0,plVar3);
  }
  pnVar6 = std::use_facet<std::__cxx11::numpunct<char>>(local_a0);
  (**(code **)(*(long *)pnVar6 + 0x20))(&local_88,pnVar6);
  std::locale::~locale(local_a0);
  if (local_80 == 0) {
    on_dec(this);
    goto LAB_0013c4f8;
  }
  plVar3 = (locale *)(this->writer->locale_).locale_;
  if (plVar3 == (locale *)0x0) {
    std::locale::locale(local_a0);
  }
  else {
    std::locale::locale(local_a0,plVar3);
  }
  pnVar6 = std::use_facet<std::__cxx11::numpunct<char>>(local_a0);
  cVar4 = (**(code **)(*(long *)pnVar6 + 0x18))(pnVar6);
  std::locale::~locale(local_a0);
  if (cVar4 == '\0') {
    on_dec(this);
    goto LAB_0013c4f8;
  }
  local_68 = (ulong)this->abs_value;
  uStack_60 = *(ulong *)((long)&this->abs_value + 8);
  auVar12 = (undefined1  [16])this->abs_value;
  iVar10 = 1;
  if ((local_68 < 10) <= uStack_60) {
    iVar8 = 4;
    local_98 = uStack_60;
    local_90 = local_68;
    do {
      iVar10 = iVar8;
      uVar9 = auVar12._8_8_;
      uVar11 = auVar12._0_8_;
      uStack_60 = local_98;
      local_68 = local_90;
      if (uVar9 == 0 && (ulong)(99 < uVar11) <= -uVar9) {
        iVar10 = iVar10 + -2;
        goto LAB_0013c441;
      }
      if (uVar9 == 0 && (ulong)(999 < uVar11) <= -uVar9) {
        iVar10 = iVar10 + -1;
        goto LAB_0013c441;
      }
      if (uVar9 < (uVar11 < 10000)) goto LAB_0013c441;
      auVar12 = __udivti3(uVar11,uVar9,10000,0);
      iVar8 = iVar10 + 4;
    } while (uVar9 != 0 || -uVar9 < (ulong)(99999 < uVar11));
    iVar10 = iVar10 + 1;
    uStack_60 = local_98;
    local_68 = local_90;
  }
LAB_0013c441:
  pplStack_50 = &local_88;
  plVar1 = (long *)((long)local_88 + local_80);
  plVar7 = local_88;
  iVar8 = iVar10;
  if (local_80 == 0) {
LAB_0013c483:
    local_58 = iVar8;
    iVar5 = iVar10;
    if (plVar7 == plVar1) goto LAB_0013c48d;
  }
  else {
    local_58 = (int)local_80 + iVar10;
    do {
      cVar2 = (char)*plVar7;
      iVar5 = iVar10 - cVar2;
      if ((iVar5 == 0 || iVar10 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) goto LAB_0013c483;
      iVar8 = iVar8 + 1;
      plVar7 = (long *)((long)plVar7 + 1);
      local_80 = local_80 + -1;
      iVar10 = iVar5;
    } while (local_80 != 0);
LAB_0013c48d:
    local_58 = (iVar5 + -1) / (int)*(char *)((long)plVar1 + -1) + local_58;
  }
  f._20_4_ = uStack_54;
  f.size = local_58;
  f._33_7_ = uStack_47;
  f.sep = cVar4;
  f.abs_value._8_8_ = uStack_60;
  f.abs_value._0_8_ = local_68;
  f.groups = (string *)pplStack_50;
  f._40_8_ = uStack_40;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  local_48 = cVar4;
  basic_writer<fmt::v6::buffer_range<char>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v6::buffer_range<char>> *)this->writer,local_58,prefix,*this->specs,
             f);
LAB_0013c4f8:
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }